

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall resetOnEndTimeFixture::~resetOnEndTimeFixture(resetOnEndTimeFixture *this)

{
  resetOnEndTimeFixture *this_local;
  
  ~resetOnEndTimeFixture(this);
  operator_delete(this,0x640);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }